

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

bool __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::iterator::operator!=(iterator *this,iterator *other)

{
  bool bVar1;
  iterator local_b0;
  iterator *local_18;
  iterator *other_local;
  iterator *this_local;
  
  local_18 = other;
  other_local = this;
  iterator(&local_b0,other);
  bVar1 = operator==(this,&local_b0);
  ~iterator(&local_b0);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool operator!=(iterator other) const { return !(*this == other); }